

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O3

bool __thiscall DataSourceAmiga::check(DataSourceAmiga *this)

{
  pointer pcVar1;
  byte bVar2;
  long *plVar4;
  Stream *this_00;
  long *plVar5;
  pointer pbVar6;
  long lVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string cp;
  __string_type __str;
  string file_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  data_files;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  undefined1 local_e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  ostream *local_b8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  long *local_68 [2];
  long local_58 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  int iVar3;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"gfxheader","");
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"gfxfast","");
  plVar4 = local_58;
  local_68[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"gfxchip","");
  __l._M_len = 3;
  __l._M_array = &local_a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,__l,(allocator_type *)&local_108);
  lVar7 = -0x60;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = 1;
  }
  else {
    pbVar6 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      pcVar1 = (pbVar6->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,pcVar1,pcVar1 + pbVar6->_M_string_length);
      local_e8._0_8_ = local_e8 + 0x10;
      pcVar1 = (this->super_DataSourceLegacy).super_DataSourceBase.path._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_e8,pcVar1,
                 pcVar1 + (this->super_DataSourceLegacy).super_DataSourceBase.path._M_string_length)
      ;
      std::__cxx11::string::_M_replace_aux((ulong)local_e8,local_e8._8_8_,0,'\x01');
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_e8,(ulong)local_a8._M_dataplus._M_p);
      local_108 = &local_f8;
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_f8 = *plVar5;
        lStack_f0 = plVar4[3];
      }
      else {
        local_f8 = *plVar5;
        local_108 = (long *)*plVar4;
      }
      local_100 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
        operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
      }
      local_c8._M_allocated_capacity = (size_type)(local_e8 + 0x30);
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_e8 + 0x20),"data","");
      Log::Logger::operator[]((Logger *)local_e8,(string *)&Log::Info);
      this_00 = Log::Stream::operator<<((Stream *)local_e8,"Looking for game data in \'");
      std::__ostream_insert<char,std::char_traits<char>>
                (this_00->stream,(char *)local_108,local_100);
      Log::Stream::operator<<(this_00,"\'...");
      Log::Stream::~Stream((Stream *)local_e8);
      if ((undefined1 *)local_c8._M_allocated_capacity != local_e8 + 0x30) {
        operator_delete((void *)local_c8._M_allocated_capacity,(ulong)(local_b8[0] + 1));
      }
      iVar3 = (*(this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source[0xe])
                        (this,&local_108);
      bVar2 = (byte)iVar3;
      if (local_108 != &local_f8) {
        operator_delete(local_108,local_f8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      pbVar6 = pbVar6 + 1;
    } while ((bVar2 & pbVar6 != local_48.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish) != 0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return (bool)bVar2;
}

Assistant:

bool
DataSourceAmiga::check() {
  std::vector<std::string> data_files = {
    "gfxheader",  // catalog file
    "gfxfast",    // fast graphics file
    "gfxchip"     // chip graphics file
  };

  for (std::string file_name : data_files) {
    std::string cp = path + '/' + file_name;
    Log::Info["data"] << "Looking for game data in '" << cp << "'...";
    if (!check_file(cp)) {
      return false;
    }
  }

  return true;
}